

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.cpp
# Opt level: O1

void __thiscall CEffects::Explosion(CEffects *this,vec2 Pos)

{
  CFlow *this_00;
  int iVar1;
  int y;
  int iVar2;
  int x;
  int iVar3;
  long in_FS_OFFSET;
  float fVar4;
  float fVar5;
  vec2 Pos_00;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  vec2 Vel;
  undefined1 auVar13 [16];
  float fVar14;
  float __x;
  float local_158;
  float fStack_154;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_128;
  CParticle local_d8;
  CParticle local_88;
  long local_38;
  undefined8 uVar6;
  undefined1 auVar11 [16];
  undefined4 uVar12;
  undefined1 extraout_var [12];
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = -8;
  do {
    fVar4 = (float)iVar2;
    iVar3 = -8;
    do {
      if (iVar3 != 0 || iVar2 != 0) {
        auVar13._0_4_ = (float)iVar3;
        __x = auVar13._0_4_ * auVar13._0_4_ + fVar4 * fVar4;
        fVar14 = SQRT(__x);
        fVar5 = fVar14;
        if (__x < 0.0) {
          fVar5 = sqrtf(__x);
        }
        fVar5 = fVar5 / -11.313708 + 1.0;
        this_00 = ((this->super_CComponent).m_pClient)->m_pFlow;
        if (__x < 0.0) {
          fVar14 = sqrtf(__x);
        }
        local_128 = Pos.field_0;
        auVar13._4_4_ = fVar4;
        auVar13._8_8_ = 0;
        auVar7._4_4_ = fVar14;
        auVar7._0_4_ = fVar14;
        auVar7._8_4_ = fVar14;
        auVar7._12_4_ = fVar14;
        auVar7 = divps(auVar13,auVar7);
        Vel.field_0.x = fVar5 * auVar7._0_4_ * 5000.0;
        Vel.field_1.y = fVar5 * auVar7._4_4_ * 5000.0;
        Pos_00.field_1.y = fVar4 * 16.0 + Pos.field_1.y;
        Pos_00.field_0.x = auVar13._0_4_ * 16.0 + local_128.x;
        CFlow::Add(this_00,Pos_00,Vel,10.0);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 9);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 9);
  local_88.m_Vel.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
  local_88.m_Vel.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
  local_88.m_Rot = 0.0;
  local_88.m_Rotspeed = 0.0;
  local_88.m_Gravity = 0.0;
  local_88.m_Friction = 0.0;
  local_88.m_Color.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
  local_88.m_Color.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
  local_88.m_Color.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
  local_88.m_Color.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
  local_88.m_Spr = 7;
  local_88.m_FlowAffected = 1.0;
  local_88.m_LifeSpan = 0.4;
  local_88.m_StartSize = 150.0;
  local_88.m_EndSize = 0.0;
  local_88.m_Pos = Pos;
  iVar2 = rand();
  fVar4 = (float)iVar2 * 4.656613e-10 * 3.1415927;
  local_88.m_Rot = fVar4 + fVar4;
  CParticles::Add(((this->super_CComponent).m_pClient)->m_pParticles,1,&local_88);
  iVar2 = 0x18;
  do {
    local_d8.m_Vel.field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)0x0;
    local_d8.m_Vel.field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x0;
    local_d8.m_LifeSpan = 0.0;
    local_d8.m_StartSize = 32.0;
    local_d8.m_EndSize = 32.0;
    local_d8.m_Rot = 0.0;
    local_d8.m_Rotspeed = 0.0;
    local_d8.m_Gravity = 0.0;
    local_d8.m_Friction = 0.0;
    local_d8.m_Color.field_0 = (anon_union_4_2_94730227_for_vector4_base<float>_1)0x3f800000;
    local_d8.m_Color.field_1 = (anon_union_4_2_947300d3_for_vector4_base<float>_3)0x3f800000;
    local_d8.m_Color.field_2 = (anon_union_4_2_94730039_for_vector4_base<float>_5)0x3f800000;
    local_d8.m_Color.field_3 = (anon_union_4_2_94730017_for_vector4_base<float>_7)0x3f800000;
    local_d8.m_Spr = 5;
    local_d8.m_FlowAffected = 1.0;
    local_d8.m_Pos = Pos;
    iVar3 = rand();
    iVar1 = rand();
    auVar8._0_4_ = (float)iVar3 * 4.656613e-10 + -0.5;
    auVar8._4_4_ = (float)iVar1 * 4.656613e-10 + -0.5;
    auVar8._8_8_ = 0;
    fVar4 = auVar8._0_4_ * auVar8._0_4_ + auVar8._4_4_ * auVar8._4_4_;
    if (fVar4 < 0.0) {
      auVar9._0_4_ = sqrtf(fVar4);
      auVar9._4_12_ = extraout_var;
      uVar6 = auVar9._0_8_;
    }
    else {
      uVar6 = CONCAT44(auVar8._4_4_,SQRT(fVar4));
    }
    uVar12 = (undefined4)((ulong)uVar6 >> 0x20);
    auVar11._8_4_ = uVar12;
    auVar11._0_8_ = uVar6;
    auVar11._12_4_ = uVar12;
    auVar10._0_4_ = (undefined4)uVar6;
    auVar10._8_8_ = auVar11._8_8_;
    auVar10._4_4_ = auVar10._0_4_;
    auVar13 = divps(auVar8,auVar10);
    iVar3 = rand();
    fVar4 = ((float)iVar3 * 4.656613e-10 * 0.2 + 1.0) * 1000.0;
    local_158 = auVar13._0_4_;
    fStack_154 = auVar13._4_4_;
    local_d8.m_Vel.field_0.x = fVar4 * local_158;
    local_d8.m_Vel.field_1.y = fVar4 * fStack_154;
    iVar3 = rand();
    local_d8.m_LifeSpan = (float)iVar3 * 4.656613e-10 * 0.4 + 0.5;
    iVar3 = rand();
    local_d8.m_StartSize = (float)iVar3 * 4.656613e-10 * 8.0 + 32.0;
    local_d8.m_EndSize = 0.0;
    iVar3 = rand();
    local_d8.m_Friction = 0.4;
    local_d8.m_Gravity = (float)iVar3 * 4.656613e-10 * -800.0;
    iVar3 = rand();
    local_d8.m_Color.field_1.y = (float)iVar3 * 4.656613e-10 * -0.25 + 0.75;
    local_d8.m_Color.field_0.x = local_d8.m_Color.field_1.y;
    local_d8.m_Color.field_3.w = (float)iVar3 * 4.656613e-10 * 0.0 + 1.0;
    local_d8.m_Color.field_2.z = local_d8.m_Color.field_1.y;
    CParticles::Add(((this->super_CComponent).m_pClient)->m_pParticles,2,&local_d8);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEffects::Explosion(vec2 Pos)
{
	// add to flow
	for(int y = -8; y <= 8; y++)
		for(int x = -8; x <= 8; x++)
		{
			if(x == 0 && y == 0)
				continue;

			float a = 1 - (length(vec2(x,y)) / length(vec2(8,8)));
			m_pClient->m_pFlow->Add(Pos+vec2(x,y)*16, normalize(vec2(x,y))*5000.0f*a, 10.0f);
		}

	// add the explosion
	CParticle p;
	p.SetDefault();
	p.m_Spr = SPRITE_PART_EXPL01;
	p.m_Pos = Pos;
	p.m_LifeSpan = 0.4f;
	p.m_StartSize = 150.0f;
	p.m_EndSize = 0;
	p.m_Rot = random_float()*pi*2;
	m_pClient->m_pParticles->Add(CParticles::GROUP_EXPLOSIONS, &p);

	// add the smoke
	for(int i = 0; i < 24; i++)
	{
		CParticle p;
		p.SetDefault();
		p.m_Spr = SPRITE_PART_SMOKE;
		p.m_Pos = Pos;
		p.m_Vel = RandomDir() * ((1.0f + random_float()*0.2f) * 1000.0f);
		p.m_LifeSpan = 0.5f + random_float()*0.4f;
		p.m_StartSize = 32.0f + random_float()*8;
		p.m_EndSize = 0;
		p.m_Gravity = random_float()*-800.0f;
		p.m_Friction = 0.4f;
		p.m_Color = mix(vec4(0.75f,0.75f,0.75f,1.0f), vec4(0.5f,0.5f,0.5f,1.0f), random_float());
		m_pClient->m_pParticles->Add(CParticles::GROUP_GENERAL, &p);
	}
}